

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hashing.h
# Opt level: O0

type llvm::hashing::detail::hash_combine_range_impl<unsigned_int_const>(uint *first,uint *last)

{
  uint64_t uVar1;
  ulong length_00;
  undefined1 local_80 [8];
  hash_state state;
  char *s_aligned_end;
  size_t length;
  char *s_end;
  char *s_begin;
  uint64_t seed;
  uint *last_local;
  uint *first_local;
  
  uVar1 = get_execution_seed();
  length_00 = std::distance<char_const*>((char *)first,(char *)last);
  if (length_00 < 0x41) {
    uVar1 = hash_short((char *)first,length_00,uVar1);
    hash_code::hash_code((hash_code *)&first_local,uVar1);
  }
  else {
    state.h6 = (long)first + (length_00 & 0xffffffffffffffc0);
    hash_state::create((hash_state *)local_80,(char *)first,uVar1);
    for (s_end = (char *)(first + 0x10); s_end != (char *)state.h6; s_end = s_end + 0x40) {
      hash_state::mix((hash_state *)local_80,s_end);
    }
    if ((length_00 & 0x3f) != 0) {
      hash_state::mix((hash_state *)local_80,(char *)(last + -0x10));
    }
    uVar1 = hash_state::finalize((hash_state *)local_80,length_00);
    hash_code::hash_code((hash_code *)&first_local,uVar1);
  }
  return (type)(size_t)first_local;
}

Assistant:

typename std::enable_if<is_hashable_data<ValueT>::value, hash_code>::type
hash_combine_range_impl(ValueT *first, ValueT *last) {
  const uint64_t seed = get_execution_seed();
  const char *s_begin = reinterpret_cast<const char *>(first);
  const char *s_end = reinterpret_cast<const char *>(last);
  const size_t length = std::distance(s_begin, s_end);
  if (length <= 64)
    return hash_short(s_begin, length, seed);

  const char *s_aligned_end = s_begin + (length & ~63);
  hash_state state = state.create(s_begin, seed);
  s_begin += 64;
  while (s_begin != s_aligned_end) {
    state.mix(s_begin);
    s_begin += 64;
  }
  if (length & 63)
    state.mix(s_end - 64);

  return state.finalize(length);
}